

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O0

MPP_RET h264e_vepu_prep_get_addr(HalH264eVepuPrep *prep,MppBuffer buffer,RK_U32 (*addr) [3])

{
  RK_U32 RVar1;
  size_t sVar2;
  size_t size;
  RK_U32 fd;
  RK_U32 (*addr_local) [3];
  MppBuffer buffer_local;
  HalH264eVepuPrep *prep_local;
  
  RVar1 = mpp_buffer_get_fd_with_caller(buffer,"h264e_vepu_prep_get_addr");
  sVar2 = mpp_buffer_get_size_with_caller(buffer,"h264e_vepu_prep_get_addr");
  if ((hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","enter\n","h264e_vepu_prep_get_addr");
  }
  (*addr)[0] = RVar1;
  (*addr)[1] = RVar1;
  (*addr)[2] = RVar1;
  if (sVar2 < prep->size_y) {
    _mpp_log_l(2,"hal_h264e_vepu_v2",
               "warnning: input buffer size 0x%x is smaller than required size 0x%x",(char *)0x0,
               sVar2,prep->size_y);
  }
  if ((prep->size_c != 0) && ((prep->offset_cb != 0 || (prep->offset_cr != 0)))) {
    if ((prep->offset_cb != 0) && (sVar2 < (ulong)prep->offset_cb + prep->size_c)) {
      _mpp_log_l(2,"hal_h264e_vepu_v2",
                 "warnning: input buffer size 0x%x is smaller than cb requirement 0x%x + 0x%x",
                 (char *)0x0,sVar2,(ulong)prep->offset_cb,prep->size_c);
    }
    if ((prep->offset_cr != 0) && (sVar2 < (ulong)prep->offset_cr + prep->size_c)) {
      _mpp_log_l(2,"hal_h264e_vepu_v2",
                 "warnning: input buffer size 0x%x is smaller than cb requirement 0x%x + 0x%x",
                 (char *)0x0,sVar2,(ulong)prep->offset_cr,prep->size_c);
    }
  }
  if ((hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","leave\n","h264e_vepu_prep_get_addr");
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_vepu_prep_get_addr(HalH264eVepuPrep *prep, MppBuffer buffer,
                                 RK_U32 (*addr)[3])
{
    RK_U32 fd = (RK_U32)mpp_buffer_get_fd(buffer);
    size_t size = mpp_buffer_get_size(buffer);

    hal_h264e_dbg_buffer("enter\n");

    (*addr)[0] = fd;
    (*addr)[1] = fd;
    (*addr)[2] = fd;

    if (size < prep->size_y)
        mpp_err("warnning: input buffer size 0x%x is smaller than required size 0x%x",
                size, prep->size_y);

    if (prep->size_c && (prep->offset_cb || prep->offset_cr)) {
        if (prep->offset_cb && (size < prep->offset_cb + prep->size_c))
            mpp_err("warnning: input buffer size 0x%x is smaller than cb requirement 0x%x + 0x%x",
                    size, prep->offset_cb, prep->size_c);

        if (prep->offset_cr && (size < prep->offset_cr + prep->size_c))
            mpp_err("warnning: input buffer size 0x%x is smaller than cb requirement 0x%x + 0x%x",
                    size, prep->offset_cr, prep->size_c);
    }

    hal_h264e_dbg_buffer("leave\n");

    return MPP_OK;
}